

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O0

void __thiscall
btHashMap<btHashPtr,_int>::insert(btHashMap<btHashPtr,_int> *this,btHashPtr *key,int *value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  btHashMap<btHashPtr,_int> *in_RDX;
  btHashMap<btHashPtr,_int> *in_RSI;
  btAlignedObjectArray<int> *in_RDI;
  int newCapacity;
  int oldCapacity;
  int count;
  int index;
  int hash;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = btHashPtr::getHash((btHashPtr *)in_RSI);
  iVar2 = btAlignedObjectArray<int>::capacity(in_RDI + 2);
  uVar3 = uVar1 & iVar2 - 1U;
  iVar2 = findIndex(in_RDX,(btHashPtr *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
  if (iVar2 == -1) {
    iVar2 = btAlignedObjectArray<int>::size(in_RDI + 2);
    iVar4 = btAlignedObjectArray<int>::capacity(in_RDI + 2);
    btAlignedObjectArray<int>::push_back
              ((btAlignedObjectArray<int> *)CONCAT44(in_stack_ffffffffffffffd4,uVar1),(int *)in_RDI)
    ;
    btAlignedObjectArray<btHashPtr>::push_back
              ((btAlignedObjectArray<btHashPtr> *)CONCAT44(in_stack_ffffffffffffffd4,uVar1),
               (btHashPtr *)in_RDI);
    iVar5 = btAlignedObjectArray<int>::capacity(in_RDI + 2);
    if (iVar4 < iVar5) {
      growTables(in_RSI,(btHashPtr *)in_RDX);
      uVar3 = btHashPtr::getHash((btHashPtr *)in_RSI);
      iVar4 = btAlignedObjectArray<int>::capacity(in_RDI + 2);
      uVar3 = uVar3 & iVar4 - 1U;
    }
    piVar6 = btAlignedObjectArray<int>::operator[](in_RDI,uVar3);
    iVar4 = *piVar6;
    piVar6 = btAlignedObjectArray<int>::operator[](in_RDI + 1,iVar2);
    *piVar6 = iVar4;
    piVar6 = btAlignedObjectArray<int>::operator[](in_RDI,uVar3);
    *piVar6 = iVar2;
  }
  else {
    iVar4 = *(int *)&in_RDX->m_hashTable;
    piVar6 = btAlignedObjectArray<int>::operator[](in_RDI + 2,iVar2);
    *piVar6 = iVar4;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}